

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

void Sim_UtilTransferNodeOne
               (Abc_Obj_t *pNode,Vec_Ptr_t *vSimInfo,int nSimWords,int nOffset,int fShift)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) - 5 < 0xfffffffe) {
    __assert_fail("Abc_ObjIsCo(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sim/simUtils.c"
                  ,0x15a,"void Sim_UtilTransferNodeOne(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
  }
  iVar1 = pNode->Id;
  if ((-1 < (long)iVar1) && (iVar1 < vSimInfo->nSize)) {
    uVar2 = *(pNode->vFanins).pArray;
    if ((-1 < (long)(int)uVar2) && (uVar2 < (uint)vSimInfo->nSize)) {
      iVar5 = 0;
      if (0 < fShift) {
        iVar5 = nSimWords;
      }
      pvVar3 = vSimInfo->pArray[iVar1];
      pvVar4 = vSimInfo->pArray[(int)uVar2];
      if ((*(uint *)&pNode->field_0x14 >> 10 & 1) == 0) {
        if (0 < nSimWords) {
          uVar6 = 0;
          do {
            *(undefined4 *)((long)pvVar3 + uVar6 * 4 + (long)(iVar5 + nOffset) * 4) =
                 *(undefined4 *)((long)pvVar4 + uVar6 * 4 + (long)nOffset * 4);
            uVar6 = uVar6 + 1;
          } while ((uint)nSimWords != uVar6);
        }
      }
      else if (0 < nSimWords) {
        uVar6 = 0;
        do {
          *(uint *)((long)pvVar3 + uVar6 * 4 + (long)(iVar5 + nOffset) * 4) =
               ~*(uint *)((long)pvVar4 + uVar6 * 4 + (long)nOffset * 4);
          uVar6 = uVar6 + 1;
        } while ((uint)nSimWords != uVar6);
      }
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Sim_UtilTransferNodeOne( Abc_Obj_t * pNode, Vec_Ptr_t * vSimInfo, int nSimWords, int nOffset, int fShift )
{
    unsigned * pSimmNode, * pSimmNode1;
    int k, fComp1;
    // simulate the internal nodes
    assert( Abc_ObjIsCo(pNode) );
    pSimmNode  = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
    pSimmNode1 = (unsigned *)Vec_PtrEntry(vSimInfo, Abc_ObjFaninId0(pNode));
    pSimmNode  += nOffset + (fShift > 0)*nSimWords;
    pSimmNode1 += nOffset;
    fComp1 = Abc_ObjFaninC0(pNode);
    if ( fComp1 )
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] = ~pSimmNode1[k];
    else 
        for ( k = 0; k < nSimWords; k++ )
            pSimmNode[k] =  pSimmNode1[k];
}